

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

ReduceSumSquareLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_reducesumsquare
          (NeuralNetworkLayer *this)

{
  ulong uVar1;
  ReduceSumSquareLayerParams *pRVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] != 0x50a) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x50a;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    pRVar2 = google::protobuf::Arena::
             CreateMaybeMessage<CoreML::Specification::ReduceSumSquareLayerParams>(arena);
    (this->layer_).reducesumsquare_ = pRVar2;
  }
  return (ReduceSumSquareLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ReduceSumSquareLayerParams* NeuralNetworkLayer::_internal_mutable_reducesumsquare() {
  if (!_internal_has_reducesumsquare()) {
    clear_layer();
    set_has_reducesumsquare();
    layer_.reducesumsquare_ = CreateMaybeMessage< ::CoreML::Specification::ReduceSumSquareLayerParams >(GetArenaForAllocation());
  }
  return layer_.reducesumsquare_;
}